

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

int Abc_SclCheckCommonInputs(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pFanin_00;
  char *pcVar5;
  int local_2c;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pObj_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 <= local_2c) {
      return 0;
    }
    pFanin_00 = Abc_ObjFanin(pObj,local_2c);
    iVar1 = Abc_NodeFindFanin(pFanin,pFanin_00);
    if (-1 < iVar1) break;
    local_2c = local_2c + 1;
  }
  uVar2 = Abc_ObjId(pObj);
  uVar3 = Abc_ObjId(pFanin);
  uVar4 = Abc_ObjId(pFanin_00);
  printf("Node %d and its fanin %d have common fanin %d.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  pcVar5 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  printf("%-16s : ",pcVar5);
  Abc_ObjPrint(_stdout,pObj);
  pcVar5 = Mio_GateReadName((Mio_Gate_t *)(pFanin->field_5).pData);
  printf("%-16s : ",pcVar5);
  Abc_ObjPrint(_stdout,pFanin);
  if ((pFanin_00->field_5).pData != (void *)0x0) {
    pcVar5 = Mio_GateReadName((Mio_Gate_t *)(pFanin_00->field_5).pData);
    printf("%-16s : ",pcVar5);
  }
  Abc_ObjPrint(_stdout,pFanin_00);
  return 1;
}

Assistant:

int Abc_SclCheckCommonInputs( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pTemp;
    int i;
    Abc_ObjForEachFanin( pObj, pTemp, i )
        if ( Abc_NodeFindFanin( pFanin, pTemp ) >= 0 )
        {
            printf( "Node %d and its fanin %d have common fanin %d.\n", Abc_ObjId(pObj), Abc_ObjId(pFanin), Abc_ObjId(pTemp) );

            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pObj->pData) ); 
            Abc_ObjPrint( stdout, pObj );

            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pFanin->pData) ); 
            Abc_ObjPrint( stdout, pFanin );

            if ( pTemp->pData )
            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pTemp->pData) ); 
            Abc_ObjPrint( stdout, pTemp );
            return 1;
        }
    return 0;
}